

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O1

void __thiscall
MethodProperty_SetPiped_Test::~MethodProperty_SetPiped_Test(MethodProperty_SetPiped_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MethodProperty, SetPiped)
{
  BasicMethodProperties obj;
  BasicMethodProperties obj2;
  BasicMethodProperties obj3;
  
  obj3.string_value = obj2.string_value = "john";
  
  EXPECT_EQ( "john", obj2.string_value() );
  EXPECT_EQ( "john", obj3.string_value() );
  
  obj.getStringValue2Test() = "kate";
  obj3.string_value = obj2.string_value = obj.string_value;
  
  EXPECT_EQ( "kate", obj2.string_value() );
  EXPECT_EQ( "kate", obj3.string_value() );
  
  obj.getStringValue2Test() = "bob";
  obj3.string_value3 = obj2.string_value2 = obj.string_value;
  
  EXPECT_EQ( "bob", obj2.string_value2() );
  EXPECT_EQ( "bob", obj3.string_value3() );
  
  obj.getStringValueTest() = "jane";
  obj3.string_value2 = obj2.string_value = obj.ro_string_value;
  
  EXPECT_EQ( "jane", obj2.string_value() );
  EXPECT_EQ( "jane", obj3.string_value2() );

  obj3.int_value = obj2.long_value = 24;
  EXPECT_EQ( 24, obj2.long_value() );
  EXPECT_EQ( 24, obj3.int_value() );
  
  obj3.int_value2 = obj2.long_value = 71;
  EXPECT_EQ( 71, obj2.long_value() );
  EXPECT_EQ( 71, obj3.int_value2() );
  
  obj3.int_value3 = obj2.long_value = 54;
  EXPECT_EQ( 54, obj2.long_value() );
  EXPECT_EQ( 54, obj3.int_value3() );

  obj.getIntValueTest() = 75;
  obj3.int_value = obj2.long_value = obj.ro_int_value;
  EXPECT_EQ( 75, obj2.long_value() );
  EXPECT_EQ( 75, obj3.int_value3() );
}